

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_compressBlock_internal
                 (ZSTD_CCtx *zc,void *dst,size_t dstCapacity,void *src,size_t srcSize)

{
  ZSTD_matchState_t *ms;
  FSE_CTable *pFVar1;
  FSE_CTable *__dest;
  undefined8 uVar2;
  undefined8 uVar3;
  U32 UVar4;
  ZSTD_strategy ZVar5;
  HUF_repeat HVar6;
  ZSTD_compressedBlockState_t *pZVar7;
  ZSTD_compressedBlockState_t *hufTable;
  BYTE *pBVar8;
  symbolEncodingType_e sVar9;
  size_t __n;
  byte *pbVar10;
  ulong uVar11;
  long lVar12;
  size_t sVar13;
  undefined4 extraout_var;
  uint uVar14;
  int iVar15;
  int iVar16;
  U32 *pUVar17;
  BYTE *pBVar18;
  ulong srcSize_00;
  byte *pbVar19;
  uint uVar20;
  bool bVar21;
  long lVar22;
  rawSeqStore_t *rawSeqStore;
  byte *pbVar23;
  BYTE *istart;
  FSE_CTable *__dest_00;
  ulong uVar24;
  seqStore_t *psVar25;
  undefined1 auVar26 [16];
  size_t sVar27;
  U32 max;
  ZSTD_compressedBlockState_t *local_178;
  U32 *local_170;
  ulong local_168;
  seqStore_t *local_160;
  seqDef *local_158;
  BYTE *local_150;
  ulong local_148;
  BYTE *local_140;
  symbolEncodingType_e local_134;
  FSE_CTable *local_130;
  seqDef *local_128;
  undefined8 local_120;
  FSE_CTable *local_118;
  BYTE *local_110;
  U32 count [53];
  
  if (srcSize < 7) {
    ZSTD_ldm_skipSequences(&zc->externSeqStore,srcSize,(zc->appliedParams).cParams.searchLength);
    return 0;
  }
  (zc->seqStore).lit = (zc->seqStore).litStart;
  (zc->seqStore).sequences = (zc->seqStore).sequencesStart;
  (zc->seqStore).longLengthID = 0;
  pZVar7 = (zc->blockState).prevCBlock;
  (zc->blockState).matchState.opt.symbolCosts = &pZVar7->entropy;
  uVar14 = (int)src - *(int *)&(zc->blockState).matchState.window.base;
  UVar4 = (zc->blockState).matchState.nextToUpdate;
  if (UVar4 + 0x180 < uVar14) {
    uVar20 = (uVar14 - UVar4) - 0x180;
    if (0xbf < uVar20) {
      uVar20 = 0xc0;
    }
    (zc->blockState).matchState.nextToUpdate = uVar14 - uVar20;
  }
  ms = &(zc->blockState).matchState;
  local_160 = &zc->seqStore;
  uVar14 = (zc->blockState).matchState.window.dictLimit;
  uVar20 = (zc->blockState).matchState.window.lowLimit;
  pUVar17 = ((zc->blockState).nextCBlock)->rep;
  for (lVar22 = 0; lVar22 != 3; lVar22 = lVar22 + 1) {
    pUVar17[lVar22] = pZVar7->rep[lVar22];
  }
  if ((zc->externSeqStore).pos < (zc->externSeqStore).size) {
    rawSeqStore = &zc->externSeqStore;
LAB_001493f6:
    __n = ZSTD_ldm_blockCompress
                    (rawSeqStore,ms,local_160,pUVar17,&(zc->appliedParams).cParams,src,srcSize,
                     (uint)(uVar20 < uVar14));
  }
  else {
    if ((zc->appliedParams).ldmParams.enableLdm != 0) {
      count[2] = 0;
      count[3] = 0;
      count[4] = 0;
      count[5] = 0;
      count._0_8_ = zc->ldmSequences;
      count._24_8_ = zc->maxNbLdmSequences;
      sVar13 = ZSTD_ldm_generateSequences
                         (&zc->ldmState,(rawSeqStore_t *)count,&(zc->appliedParams).ldmParams,src,
                          srcSize);
      if (0xffffffffffffff88 < sVar13) {
        return sVar13;
      }
      pUVar17 = ((zc->blockState).nextCBlock)->rep;
      rawSeqStore = (rawSeqStore_t *)count;
      goto LAB_001493f6;
    }
    __n = (*ZSTD_selectBlockCompressor::blockCompressor[uVar20 < uVar14]
            [(zc->appliedParams).cParams.strategy])
                    (ms,local_160,pUVar17,&(zc->appliedParams).cParams,src,srcSize);
  }
  memcpy((zc->seqStore).lit,(void *)((long)src + (srcSize - __n)),__n);
  pBVar18 = (zc->seqStore).lit + __n;
  (zc->seqStore).lit = pBVar18;
  pZVar7 = (zc->blockState).prevCBlock;
  hufTable = (zc->blockState).nextCBlock;
  local_170 = zc->entropyWorkspace;
  uVar14 = (zc->appliedParams).cParams.windowLog;
  local_148 = (ulong)(uint)zc->bmi2;
  local_128 = (zc->seqStore).sequencesStart;
  local_150 = (zc->seqStore).ofCode;
  local_140 = (zc->seqStore).llCode;
  local_110 = (zc->seqStore).mlCode;
  local_158 = (zc->seqStore).sequences;
  pBVar8 = (zc->seqStore).litStart;
  ZVar5 = (zc->appliedParams).cParams.strategy;
  iVar16 = (zc->appliedParams).disableLiteralCompression;
  (hufTable->entropy).hufCTable_repeatMode = (pZVar7->entropy).hufCTable_repeatMode;
  srcSize_00 = (long)pBVar18 - (long)pBVar8;
  memcpy(hufTable,pZVar7,0x400);
  local_178 = pZVar7;
  if (iVar16 == 0) {
    HVar6 = (pZVar7->entropy).hufCTable_repeatMode;
    uVar24 = 0x3f;
    if (HVar6 == HUF_repeat_valid) {
      uVar24 = 6;
    }
    if (uVar24 < srcSize_00) {
      uVar24 = ((ulong)(0x3ff < srcSize_00) - (ulong)(srcSize_00 < 0x4000)) + 4;
      sVar13 = dstCapacity - uVar24;
      if (dstCapacity < uVar24 || sVar13 == 0) {
        pbVar10 = (byte *)0xffffffffffffffba;
      }
      else {
        local_168 = srcSize_00 >> 6;
        count[0] = HVar6;
        bVar21 = srcSize_00 < 0x401 && ZVar5 < ZSTD_lazy;
        if (uVar24 == 3 && HVar6 == HUF_repeat_valid || srcSize_00 < 0x100) {
          uVar11 = HUF_compress1X_repeat
                             ((void *)((long)dst + uVar24),sVar13,pBVar8,srcSize_00,0xff,0xb,
                              local_170,0x1800,(HUF_CElt *)hufTable,count,(uint)bVar21,
                              (int)local_148);
        }
        else {
          uVar11 = HUF_compress4X_repeat
                             ((void *)((long)dst + uVar24),sVar13,pBVar8,srcSize_00,0xff,0xb,
                              local_170,0x1800,(HUF_CElt *)hufTable,count,(uint)bVar21,
                              (int)local_148);
        }
        uVar20 = 3 - (count[0] == 0);
        if ((srcSize_00 - local_168) - 2 <= uVar11 || 0xffffffffffffff87 < uVar11 - 1) {
          memcpy(hufTable,local_178,0x400);
          goto LAB_0014954c;
        }
        iVar16 = (int)srcSize_00;
        if (uVar11 == 1) {
          memcpy(hufTable,local_178,0x400);
          lVar22 = ((ulong)(0x1f < srcSize_00) + 1) - (ulong)(srcSize_00 < 0x1000);
          lVar12 = lVar22 + 1;
          if (lVar12 == 3) {
            *(uint *)dst = iVar16 << 4 | 0xd;
          }
          else if ((int)lVar12 == 2) {
            *(ushort *)dst = (ushort)(iVar16 << 4) | 5;
          }
          else {
            *(char *)dst = (char)srcSize_00 * '\b' + '\x01';
          }
          *(BYTE *)((long)dst + lVar12) = *pBVar8;
          pbVar10 = (byte *)(ulong)((int)lVar22 + 2);
        }
        else {
          if (count[0] == 0) {
            (hufTable->entropy).hufCTable_repeatMode = HUF_repeat_check;
          }
          iVar15 = (int)uVar11;
          if (uVar24 == 5) {
            *(uint *)dst = iVar15 * 0x400000 + iVar16 * 0x10 | uVar20 | 0xc;
            *(char *)((long)dst + 4) = (char)(uVar11 >> 10);
          }
          else if (uVar24 == 4) {
            *(uint *)dst = iVar15 * 0x40000 + iVar16 * 0x10 | uVar20 | 8;
          }
          else {
            iVar16 = iVar15 * 0x4000 +
                     ((uVar20 | iVar16 * 0x10 +
                                (uint)(uVar24 == 3 && HVar6 == HUF_repeat_valid ||
                                      srcSize_00 < 0x100) * 4) ^ 4);
            *(short *)dst = (short)iVar16;
            *(char *)((long)dst + 2) = (char)((uint)iVar16 >> 0x10);
          }
          pbVar10 = (byte *)(uVar11 + uVar24);
        }
      }
    }
    else {
      pbVar10 = (byte *)ZSTD_noCompressLiterals(dst,dstCapacity,pBVar8,srcSize_00);
    }
  }
  else {
LAB_0014954c:
    pbVar10 = (byte *)ZSTD_noCompressLiterals(dst,dstCapacity,pBVar8,srcSize_00);
  }
  uVar20 = ZSTD_isError((size_t)pbVar10);
  pZVar7 = local_178;
  if (uVar20 == 0) {
    if ((long)(dstCapacity - (long)pbVar10) < 4) {
      pbVar10 = (byte *)0xffffffffffffffba;
    }
    else {
      psVar25 = (seqStore_t *)((long)local_158 - (long)local_128 >> 3);
      pbVar10 = pbVar10 + (long)dst;
      if (psVar25 < (seqStore_t *)0x7f) {
        *pbVar10 = (byte)psVar25;
        pbVar23 = pbVar10 + 1;
      }
      else if (psVar25 < (seqStore_t *)0x7f00) {
        *pbVar10 = (byte)((ulong)psVar25 >> 8) | 0x80;
        pbVar10[1] = (byte)psVar25;
        pbVar23 = pbVar10 + 2;
      }
      else {
        *pbVar10 = 0xff;
        *(short *)(pbVar10 + 1) = (short)psVar25 + -0x7f00;
        pbVar23 = pbVar10 + 3;
      }
      pFVar1 = (hufTable->entropy).litlengthCTable;
      __dest_00 = (hufTable->entropy).offcodeCTable;
      __dest = (hufTable->entropy).matchlengthCTable;
      if (local_158 == local_128) {
        memcpy(pFVar1,(local_178->entropy).litlengthCTable,0x524);
        (hufTable->entropy).litlength_repeatMode = (pZVar7->entropy).litlength_repeatMode;
        memcpy(__dest_00,(pZVar7->entropy).offcodeCTable,0x304);
        (hufTable->entropy).offcode_repeatMode = (pZVar7->entropy).offcode_repeatMode;
        memcpy(__dest,(pZVar7->entropy).matchlengthCTable,0x5ac);
        (hufTable->entropy).matchlength_repeatMode = (pZVar7->entropy).matchlength_repeatMode;
        pbVar10 = pbVar23 + -(long)dst;
      }
      else {
        pbVar19 = pbVar23 + 1;
        local_158 = (seqDef *)pFVar1;
        local_130 = __dest_00;
        local_118 = __dest;
        ZSTD_seqToCodes(local_160);
        pUVar17 = local_170;
        max = 0x23;
        local_160 = psVar25;
        sVar13 = FSE_countFast_wksp(count,&max,local_140,(size_t)psVar25,local_170);
        pZVar7 = local_178;
        (hufTable->entropy).litlength_repeatMode = (local_178->entropy).litlength_repeatMode;
        sVar27 = 0x149866;
        sVar9 = ZSTD_selectEncodingType
                          (&(hufTable->entropy).litlength_repeatMode,sVar13,(size_t)local_160,6,
                           ZSTD_defaultAllowed);
        psVar25 = local_160;
        local_168 = dstCapacity + (long)dst;
        pbVar10 = (byte *)ZSTD_buildCTable(pbVar19,(dstCapacity + (long)dst) - (long)pbVar19,
                                           &local_158->offset,9,sVar9,count,max,local_140,
                                           (size_t)local_160,LL_defaultNorm,6,0x23,
                                           (pZVar7->entropy).litlengthCTable,0x524,pUVar17,sVar27);
        uVar20 = ZSTD_isError((size_t)pbVar10);
        if (uVar20 == 0) {
          pbVar19 = pbVar19 + (long)pbVar10;
          max = 0x1f;
          local_134 = sVar9;
          sVar13 = FSE_countFast_wksp(count,&max,local_150,(size_t)psVar25,local_170);
          pZVar7 = local_178;
          UVar4 = max;
          (hufTable->entropy).offcode_repeatMode = (local_178->entropy).offcode_repeatMode;
          sVar27 = 0x14995b;
          sVar9 = ZSTD_selectEncodingType
                            (&(hufTable->entropy).offcode_repeatMode,sVar13,(size_t)psVar25,5,
                             (uint)(max < 0x1d));
          pbVar10 = (byte *)ZSTD_buildCTable(pbVar19,local_168 - (long)pbVar19,local_130,8,sVar9,
                                             count,UVar4,local_150,(size_t)psVar25,OF_defaultNorm,5,
                                             0x1c,(pZVar7->entropy).offcodeCTable,0x304,local_170,
                                             sVar27);
          uVar20 = ZSTD_isError((size_t)pbVar10);
          pBVar8 = local_110;
          if (uVar20 == 0) {
            pbVar19 = pbVar19 + (long)pbVar10;
            max = 0x34;
            local_120 = CONCAT44(extraout_var,sVar9);
            sVar13 = FSE_countFast_wksp(count,&max,local_110,(size_t)psVar25,local_170);
            pZVar7 = local_178;
            (hufTable->entropy).matchlength_repeatMode = (local_178->entropy).matchlength_repeatMode
            ;
            sVar27 = 0x149a38;
            sVar9 = ZSTD_selectEncodingType
                              (&(hufTable->entropy).matchlength_repeatMode,sVar13,(size_t)psVar25,6,
                               ZSTD_defaultAllowed);
            pFVar1 = local_118;
            local_178 = (ZSTD_compressedBlockState_t *)(ulong)sVar9;
            pbVar10 = (byte *)ZSTD_buildCTable(pbVar19,local_168 - (long)pbVar19,local_118,9,sVar9,
                                               count,max,pBVar8,(size_t)psVar25,ML_defaultNorm,6,
                                               0x34,(pZVar7->entropy).matchlengthCTable,0x5ac,
                                               local_170,sVar27);
            uVar20 = ZSTD_isError((size_t)pbVar10);
            if (uVar20 == 0) {
              pbVar19 = pbVar19 + (long)pbVar10;
              *pbVar23 = ((byte)((int)local_120 << 4) | (byte)(local_134 << 6)) +
                         (char)local_178 * '\x04';
              pbVar10 = (byte *)ZSTD_encodeSequences
                                          (pbVar19,local_168 - (long)pbVar19,pFVar1,pBVar8,local_130
                                           ,local_150,&local_158->offset,local_140,local_128,
                                           (size_t)psVar25,(uint)(0x39 < uVar14),(int)local_148);
              uVar14 = ZSTD_isError((size_t)pbVar10);
              if (uVar14 == 0) {
                pbVar10 = pbVar19 + ((long)pbVar10 - (long)dst);
              }
            }
          }
        }
      }
    }
  }
  if ((dstCapacity < srcSize) || (pbVar10 != (byte *)0xffffffffffffffba)) {
    uVar14 = ZSTD_isError((size_t)pbVar10);
    if (uVar14 != 0) goto LAB_00149b59;
    if (pbVar10 < (byte *)((srcSize - (srcSize >> 6)) + -2)) {
      if ((hufTable->entropy).offcode_repeatMode == FSE_repeat_valid) {
        (hufTable->entropy).offcode_repeatMode = FSE_repeat_check;
      }
      goto LAB_00149b59;
    }
  }
  pbVar10 = (byte *)0x0;
LAB_00149b59:
  uVar14 = ZSTD_isError((size_t)pbVar10);
  if ((pbVar10 != (byte *)0x0) && (uVar14 == 0)) {
    uVar2 = (zc->blockState).prevCBlock;
    uVar3 = (zc->blockState).nextCBlock;
    auVar26._8_4_ = (int)uVar2;
    auVar26._0_8_ = uVar3;
    auVar26._12_4_ = (int)((ulong)uVar2 >> 0x20);
    (zc->blockState).prevCBlock = (ZSTD_compressedBlockState_t *)uVar3;
    (zc->blockState).nextCBlock = (ZSTD_compressedBlockState_t *)auVar26._8_8_;
  }
  return (size_t)pbVar10;
}

Assistant:

static size_t ZSTD_compressBlock_internal(ZSTD_CCtx* zc,
                                        void* dst, size_t dstCapacity,
                                        const void* src, size_t srcSize)
{
    ZSTD_matchState_t* const ms = &zc->blockState.matchState;
    DEBUGLOG(5, "ZSTD_compressBlock_internal (dstCapacity=%zu, dictLimit=%u, nextToUpdate=%u)",
                dstCapacity, ms->window.dictLimit, ms->nextToUpdate);

    if (srcSize < MIN_CBLOCK_SIZE+ZSTD_blockHeaderSize+1) {
        ZSTD_ldm_skipSequences(&zc->externSeqStore, srcSize, zc->appliedParams.cParams.searchLength);
        return 0;   /* don't even attempt compression below a certain srcSize */
    }
    ZSTD_resetSeqStore(&(zc->seqStore));
    ms->opt.symbolCosts = &zc->blockState.prevCBlock->entropy;   /* required for optimal parser to read stats from dictionary */

    /* limited update after a very long match */
    {   const BYTE* const base = ms->window.base;
        const BYTE* const istart = (const BYTE*)src;
        const U32 current = (U32)(istart-base);
        if (sizeof(ptrdiff_t)==8) assert(istart - base < (ptrdiff_t)(U32)(-1));   /* ensure no overflow */
        if (current > ms->nextToUpdate + 384)
            ms->nextToUpdate = current - MIN(192, (U32)(current - ms->nextToUpdate - 384));
    }

    /* select and store sequences */
    {   U32 const extDict = ZSTD_window_hasExtDict(ms->window);
        size_t lastLLSize;
        {   int i;
            for (i = 0; i < ZSTD_REP_NUM; ++i)
                zc->blockState.nextCBlock->rep[i] = zc->blockState.prevCBlock->rep[i];
        }
        if (zc->externSeqStore.pos < zc->externSeqStore.size) {
            assert(!zc->appliedParams.ldmParams.enableLdm);
            /* Updates ldmSeqStore.pos */
            lastLLSize =
                ZSTD_ldm_blockCompress(&zc->externSeqStore,
                                       ms, &zc->seqStore,
                                       zc->blockState.nextCBlock->rep,
                                       &zc->appliedParams.cParams,
                                       src, srcSize, extDict);
            assert(zc->externSeqStore.pos <= zc->externSeqStore.size);
        } else if (zc->appliedParams.ldmParams.enableLdm) {
            rawSeqStore_t ldmSeqStore = {NULL, 0, 0, 0};

            ldmSeqStore.seq = zc->ldmSequences;
            ldmSeqStore.capacity = zc->maxNbLdmSequences;
            /* Updates ldmSeqStore.size */
            CHECK_F(ZSTD_ldm_generateSequences(&zc->ldmState, &ldmSeqStore,
                                               &zc->appliedParams.ldmParams,
                                               src, srcSize));
            /* Updates ldmSeqStore.pos */
            lastLLSize =
                ZSTD_ldm_blockCompress(&ldmSeqStore,
                                       ms, &zc->seqStore,
                                       zc->blockState.nextCBlock->rep,
                                       &zc->appliedParams.cParams,
                                       src, srcSize, extDict);
            assert(ldmSeqStore.pos == ldmSeqStore.size);
        } else {   /* not long range mode */
            ZSTD_blockCompressor const blockCompressor = ZSTD_selectBlockCompressor(zc->appliedParams.cParams.strategy, extDict);
            lastLLSize = blockCompressor(ms, &zc->seqStore, zc->blockState.nextCBlock->rep, &zc->appliedParams.cParams, src, srcSize);
        }
        {   const BYTE* const lastLiterals = (const BYTE*)src + srcSize - lastLLSize;
            ZSTD_storeLastLiterals(&zc->seqStore, lastLiterals, lastLLSize);
    }   }

    /* encode sequences and literals */
    {   size_t const cSize = ZSTD_compressSequences(&zc->seqStore,
                                &zc->blockState.prevCBlock->entropy, &zc->blockState.nextCBlock->entropy,
                                &zc->appliedParams,
                                dst, dstCapacity,
                                srcSize, zc->entropyWorkspace, zc->bmi2);
        if (ZSTD_isError(cSize) || cSize == 0) return cSize;
        /* confirm repcodes and entropy tables */
        {   ZSTD_compressedBlockState_t* const tmp = zc->blockState.prevCBlock;
            zc->blockState.prevCBlock = zc->blockState.nextCBlock;
            zc->blockState.nextCBlock = tmp;
        }
        return cSize;
    }
}